

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::AggressiveDCEPass::InitializeModuleScopeLiveInstructions(AggressiveDCEPass *this)

{
  Module *pMVar1;
  DefUseManager *pDVar2;
  pointer pOVar3;
  uint **ppuVar4;
  IRContext *pIVar5;
  bool bVar6;
  char cVar7;
  uint32_t uVar8;
  CommonDebugInfoInstructions CVar9;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar10;
  Instruction *pIVar11;
  Instruction *pIVar12;
  uint **ppuVar13;
  uint uVar14;
  uint uVar15;
  Instruction *exec;
  pointer pOVar16;
  Instruction *pIVar17;
  AggressiveDCEPass **local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  AggressiveDCEPass *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  Instruction *local_40;
  uint *local_38;
  
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  for (pIVar12 = *(Instruction **)
                  ((long)&(pMVar1->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>
                  + 0x10);
      pIVar12 !=
      (Instruction *)
      ((long)&(pMVar1->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
    AddToWorklist(this,pIVar12);
  }
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar12 = *(Instruction **)
             ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  pIVar17 = (Instruction *)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (pIVar12 != pIVar17) {
    do {
      if (this->preserve_interface_ == false) {
        if (pIVar12->unique_id_ == 0) {
          __assert_fail("unique_id_ != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0xfb,"uint32_t spvtools::opt::Instruction::unique_id() const");
        }
        utils::BitVector::Set(&this->live_insts_,pIVar12->unique_id_);
        pIVar5 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar5->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar5);
        }
        pDVar2 = (pIVar5->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl;
        uVar14 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar14 = (uint)pIVar12->has_result_id_;
        }
        uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar14 + 1);
        pIVar11 = analysis::DefUseManager::GetDef(pDVar2,uVar8);
        AddToWorklist(this,pIVar11);
        uVar14 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar14 = (uint)pIVar12->has_result_id_;
        }
        if (3 < (int)((ulong)((long)(pIVar12->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pIVar12->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar14) {
          uVar14 = 3;
          do {
            pIVar5 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar5->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar5);
            }
            pDVar2 = (pIVar5->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl;
            uVar15 = (pIVar12->has_result_id_ & 1) + 1;
            if (pIVar12->has_type_id_ == false) {
              uVar15 = (uint)pIVar12->has_result_id_;
            }
            uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar15 + uVar14);
            pIVar11 = analysis::DefUseManager::GetDef(pDVar2,uVar8);
            uVar8 = (pIVar11->has_result_id_ & 1) + 1;
            if (pIVar11->has_type_id_ == false) {
              uVar8 = (uint)pIVar11->has_result_id_;
            }
            uVar8 = Instruction::GetSingleWordOperand(pIVar11,uVar8);
            if ((uVar8 == 3) && (this->remove_outputs_ == false)) {
              AddToWorklist(this,pIVar11);
            }
            uVar14 = uVar14 + 1;
            uVar15 = (pIVar12->has_result_id_ & 1) + 1;
            if (pIVar12->has_type_id_ == false) {
              uVar15 = (uint)pIVar12->has_result_id_;
            }
          } while (uVar14 < (int)((ulong)((long)(pIVar12->operands_).
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pIVar12->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                            -0x55555555 - uVar15);
        }
      }
      else {
        AddToWorklist(this,pIVar12);
      }
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar12 != pIVar17);
  }
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  for (pIVar12 = *(Instruction **)
                  ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                  0x10);
      pIVar12 !=
      (Instruction *)
      ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
    if (pIVar12->opcode_ == OpDecorate) {
      uVar14 = (pIVar12->has_result_id_ & 1) + 1;
      if (pIVar12->has_type_id_ == false) {
        uVar14 = (uint)pIVar12->has_result_id_;
      }
      uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar14 + 1);
      if (uVar8 == 0xb) {
        uVar14 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar14 = (uint)pIVar12->has_result_id_;
        }
        uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar14 + 2);
        if (uVar8 == 0x19) {
          AddToWorklist(this,pIVar12);
        }
      }
      if (((this->super_MemPass).super_Pass.context_)->preserve_bindings_ == true) {
        uVar14 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar14 = (uint)pIVar12->has_result_id_;
        }
        uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar14 + 1);
        if (uVar8 != 0x22) {
          uVar14 = (pIVar12->has_result_id_ & 1) + 1;
          if (pIVar12->has_type_id_ == false) {
            uVar14 = (uint)pIVar12->has_result_id_;
          }
          uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar14 + 1);
          if (uVar8 != 0x21) goto LAB_005264ae;
        }
        AddToWorklist(this,pIVar12);
      }
LAB_005264ae:
      if (((this->super_MemPass).super_Pass.context_)->preserve_spec_constants_ == true) {
        uVar14 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar14 = (uint)pIVar12->has_result_id_;
        }
        uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar14 + 1);
        if (uVar8 == 1) {
          AddToWorklist(this,pIVar12);
        }
      }
    }
  }
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar12 = *(Instruction **)
             ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  pIVar17 = (Instruction *)
            ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
            8);
  if (pIVar12 != pIVar17) {
    bVar6 = false;
    local_40 = pIVar17;
    do {
      CVar9 = Instruction::GetCommonDebugOpcode(pIVar12);
      if (CVar9 == CommonDebugInfoDebugGlobalVariable) {
        uStack_60 = 0;
        pcStack_50 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:663:21)>
                     ::_M_invoke;
        local_58 = std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:663:21)>
                   ::_M_manager;
        uStack_80 = 0;
        local_88 = &local_68;
        pcStack_70 = std::
                     _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                   ::_M_manager;
        pOVar3 = (pIVar12->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_68 = this;
        for (pOVar16 = (pIVar12->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start; pOVar16 != pOVar3;
            pOVar16 = pOVar16 + 1) {
          bVar6 = spvIsInIdType(pOVar16->type);
          if (bVar6) {
            ppuVar4 = (uint **)(pOVar16->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar13 = &(pOVar16->words).small_data_;
            if (ppuVar4 != (uint **)0x0) {
              ppuVar13 = ppuVar4;
            }
            local_38 = *ppuVar13;
            if (local_78 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar7 = (*pcStack_70)(&local_88,&local_38);
            if (cVar7 == '\0') break;
          }
        }
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,3);
        }
        pIVar17 = local_40;
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,3);
        }
        bVar6 = true;
      }
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar12 != pIVar17);
    if (bVar6) {
      pIVar5 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar5->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
        IRContext::BuildDebugInfoManager(pIVar5);
      }
      pIVar12 = analysis::DebugInfoManager::GetDebugInfoNone
                          ((pIVar5->debug_info_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                           .
                           super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                           ._M_head_impl);
      AddToWorklist(this,pIVar12);
    }
  }
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar12 = *(Instruction **)
             ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  do {
    if (pIVar12 ==
        (Instruction *)
        ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> + 8U))
    {
      return;
    }
    NVar10 = Instruction::GetShader100DebugOpcode(pIVar12);
    if ((int)NVar10 < 0x66) {
      if ((NVar10 == NonSemanticShaderDebugInfo100DebugCompilationUnit) ||
         (NVar10 == NonSemanticShaderDebugInfo100DebugSource)) {
LAB_0052668b:
        AddToWorklist(this,pIVar12);
      }
    }
    else if ((NVar10 == NonSemanticShaderDebugInfo100DebugEntryPoint) ||
            (NVar10 == NonSemanticShaderDebugInfo100DebugSourceContinued)) goto LAB_0052668b;
    pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

void AggressiveDCEPass::InitializeModuleScopeLiveInstructions() {
  // Keep all execution modes.
  for (auto& exec : get_module()->execution_modes()) {
    AddToWorklist(&exec);
  }
  // Keep all entry points.
  for (auto& entry : get_module()->entry_points()) {
    if (!preserve_interface_) {
      live_insts_.Set(entry.unique_id());
      // The actual function is live always.
      AddToWorklist(
          get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(1u)));
      for (uint32_t i = 3; i < entry.NumInOperands(); ++i) {
        auto* var = get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(i));
        auto storage_class = var->GetSingleWordInOperand(0u);
        // Vulkan support outputs without an associated input, but not inputs
        // without an associated output. Don't remove outputs unless explicitly
        // allowed.
        if (!remove_outputs_ &&
            spv::StorageClass(storage_class) == spv::StorageClass::Output) {
          AddToWorklist(var);
        }
      }
    } else {
      AddToWorklist(&entry);
    }
  }
  for (auto& anno : get_module()->annotations()) {
    if (anno.opcode() == spv::Op::OpDecorate) {
      // Keep workgroup size.
      if (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
              spv::Decoration::BuiltIn &&
          spv::BuiltIn(anno.GetSingleWordInOperand(2u)) ==
              spv::BuiltIn::WorkgroupSize) {
        AddToWorklist(&anno);
      }

      if (context()->preserve_bindings()) {
        // Keep all bindings.
        if ((spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
             spv::Decoration::DescriptorSet) ||
            (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
             spv::Decoration::Binding)) {
          AddToWorklist(&anno);
        }
      }

      if (context()->preserve_spec_constants()) {
        // Keep all specialization constant instructions
        if (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
            spv::Decoration::SpecId) {
          AddToWorklist(&anno);
        }
      }
    }
  }

  // For each DebugInfo GlobalVariable keep all operands except the Variable.
  // Later, if the variable is killed with KillInst(), we will set the operand
  // to DebugInfoNone. Create and save DebugInfoNone now for this possible
  // later use. This is slightly unoptimal, but it avoids generating it during
  // instruction killing when the module is not consistent.
  bool debug_global_seen = false;
  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    if (dbg.GetCommonDebugOpcode() != CommonDebugInfoDebugGlobalVariable)
      continue;
    debug_global_seen = true;
    dbg.ForEachInId([this](const uint32_t* iid) {
      Instruction* in_inst = get_def_use_mgr()->GetDef(*iid);
      if (in_inst->opcode() == spv::Op::OpVariable) return;
      AddToWorklist(in_inst);
    });
  }
  if (debug_global_seen) {
    auto dbg_none = context()->get_debug_info_mgr()->GetDebugInfoNone();
    AddToWorklist(dbg_none);
  }

  // Add top level DebugInfo to worklist
  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    auto op = dbg.GetShader100DebugOpcode();
    if (op == NonSemanticShaderDebugInfo100DebugCompilationUnit ||
        op == NonSemanticShaderDebugInfo100DebugEntryPoint ||
        op == NonSemanticShaderDebugInfo100DebugSource ||
        op == NonSemanticShaderDebugInfo100DebugSourceContinued) {
      AddToWorklist(&dbg);
    }
  }
}